

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerGLSL::should_dereference(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  bool bVar2;
  undefined8 in_RAX;
  SPIRType *pSVar3;
  SPIRVariable *pSVar4;
  SPIRExpression *pSVar5;
  size_type sVar6;
  SPIRType *pSVar7;
  ulong uVar8;
  byte bVar9;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pSVar3 = Compiler::expression_type(&this->super_Compiler,id);
  if ((pSVar3->pointer == true) &&
     (bVar2 = Compiler::expression_is_lvalue(&this->super_Compiler,id), bVar2)) {
    uVar8 = (ulong)id;
    if ((uVar8 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar1[uVar8].type == TypeVariable)) {
      pSVar4 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar8);
    }
    else {
      pSVar4 = (SPIRVariable *)0x0;
    }
    if (pSVar4 != (SPIRVariable *)0x0) {
      id = (uint32_t)pSVar4->phi_variable;
    }
    bVar9 = (byte)id;
    if (pSVar4 != (SPIRVariable *)0x0) goto LAB_001f20d5;
    if ((uVar8 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar1[uVar8].type == TypeExpression)) {
      pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar8);
    }
    else {
      pSVar5 = (SPIRExpression *)0x0;
    }
    bVar9 = 1;
    if (pSVar5 == (SPIRExpression *)0x0) goto LAB_001f20d5;
    if (pSVar5->access_chain == false) {
      pSVar4 = (SPIRVariable *)0x0;
      do {
        if ((pSVar5->loaded_from).id == 0) break;
        uStack_38 = CONCAT44((pSVar5->super_IVariant).self.id,(undefined4)uStack_38);
        sVar6 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->super_Compiler).forwarded_temporaries._M_h,
                        (key_type *)((long)&uStack_38 + 4));
        if (sVar6 == 0) break;
        pSVar7 = Compiler::expression_type(&this->super_Compiler,(pSVar5->loaded_from).id);
        if (((pSVar7->pointer == pSVar3->pointer) &&
            (pSVar7->pointer_depth == pSVar3->pointer_depth)) &&
           ((pSVar7->parent_type).id == (pSVar3->parent_type).id)) {
          uVar8 = (ulong)(pSVar5->loaded_from).id;
          if ((uVar8 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                       buffer_size) &&
             (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar1[uVar8].type == TypeVariable)) {
            pSVar4 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar8);
          }
          else {
            pSVar4 = (SPIRVariable *)0x0;
          }
          if (pSVar4 != (SPIRVariable *)0x0) goto LAB_001f2179;
          uVar8 = (ulong)(pSVar5->loaded_from).id;
          if ((uVar8 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                       buffer_size) &&
             (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar1[uVar8].type == TypeExpression)) {
            pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar8);
          }
          else {
            pSVar5 = (SPIRExpression *)0x0;
          }
          bVar2 = pSVar5 != (SPIRExpression *)0x0;
          pSVar4 = (SPIRVariable *)0x0;
        }
        else {
LAB_001f2179:
          bVar2 = false;
        }
      } while (bVar2);
      if (pSVar4 != (SPIRVariable *)0x0) {
        bVar9 = pSVar4->phi_variable;
      }
      goto LAB_001f20d5;
    }
  }
  bVar9 = 0;
LAB_001f20d5:
  return (bool)(bVar9 & 1);
}

Assistant:

bool CompilerGLSL::should_dereference(uint32_t id)
{
	const auto &type = expression_type(id);
	// Non-pointer expressions don't need to be dereferenced.
	if (!type.pointer)
		return false;

	// Handles shouldn't be dereferenced either.
	if (!expression_is_lvalue(id))
		return false;

	// If id is a variable but not a phi variable, we should not dereference it.
	if (auto *var = maybe_get<SPIRVariable>(id))
		return var->phi_variable;

	if (auto *expr = maybe_get<SPIRExpression>(id))
	{
		// If id is an access chain, we should not dereference it.
		if (expr->access_chain)
			return false;

		// If id is a forwarded copy of a variable pointer, we should not dereference it.
		SPIRVariable *var = nullptr;
		while (expr->loaded_from && expression_is_forwarded(expr->self))
		{
			auto &src_type = expression_type(expr->loaded_from);
			// To be a copy, the pointer and its source expression must be the
			// same type. Can't check type.self, because for some reason that's
			// usually the base type with pointers stripped off. This check is
			// complex enough that I've hoisted it out of the while condition.
			if (src_type.pointer != type.pointer || src_type.pointer_depth != type.pointer_depth ||
			    src_type.parent_type != type.parent_type)
				break;
			if ((var = maybe_get<SPIRVariable>(expr->loaded_from)))
				break;
			if (!(expr = maybe_get<SPIRExpression>(expr->loaded_from)))
				break;
		}

		return !var || var->phi_variable;
	}

	// Otherwise, we should dereference this pointer expression.
	return true;
}